

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cClipDistance.cpp
# Opt level: O3

void __thiscall gl3cts::ClipDistance::Utility::Framebuffer::~Framebuffer(Framebuffer *this)

{
  GLenum GVar1;
  
  if (this->m_framebuffer_id != 0) {
    (*this->m_gl->deleteFramebuffers)(1,&this->m_framebuffer_id);
    this->m_framebuffer_id = 0;
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glDeleteFramebuffers call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                    ,0x5e1);
  }
  if (this->m_renderbuffer_id != 0) {
    (*this->m_gl->deleteRenderbuffers)(1,&this->m_renderbuffer_id);
    this->m_renderbuffer_id = 0;
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glDeleteRenderbuffers call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                    ,0x5e8);
  }
  return;
}

Assistant:

gl3cts::ClipDistance::Utility::Framebuffer::~Framebuffer()
{
	if (m_framebuffer_id)
	{
		m_gl.deleteFramebuffers(1, &m_framebuffer_id);
		m_framebuffer_id = 0;
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glDeleteFramebuffers call failed.");
	}

	if (m_renderbuffer_id)
	{
		m_gl.deleteRenderbuffers(1, &m_renderbuffer_id);
		m_renderbuffer_id = 0;
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glDeleteRenderbuffers call failed.");
	}
}